

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O0

ModelWireSegment * __thiscall lsim::ModelWire::add_segment(ModelWire *this,Point *p0,Point *p1)

{
  reference this_00;
  pointer segment_00;
  ModelWireJunction *pMVar1;
  pointer segment;
  value_type local_28;
  Point *local_20;
  Point *p1_local;
  Point *p0_local;
  ModelWire *this_local;
  
  local_20 = p1;
  p1_local = p0;
  p0_local = (Point *)this;
  std::make_unique<lsim::ModelWireSegment,lsim::ModelWire*>((ModelWire **)&local_28);
  std::
  vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
  ::push_back(&this->m_segments,&local_28);
  std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>::~unique_ptr
            (&local_28);
  this_00 = std::
            vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
            ::back(&this->m_segments);
  segment_00 = std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
               ::get(this_00);
  pMVar1 = add_junction(this,p1_local,segment_00);
  ModelWireSegment::set_junction(segment_00,0,pMVar1);
  pMVar1 = add_junction(this,local_20,segment_00);
  ModelWireSegment::set_junction(segment_00,1,pMVar1);
  return segment_00;
}

Assistant:

ModelWireSegment *ModelWire::add_segment(const Point &p0, const Point &p1) {
    m_segments.push_back(std::make_unique<ModelWireSegment>(this));
    auto segment = m_segments.back().get();

    segment->set_junction(0, add_junction(p0, segment));
    segment->set_junction(1, add_junction(p1, segment));
    return segment;
}